

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void __thiscall
ImPlot::ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>::
ShadedRenderer(ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
               *this,GetterYs<float> *getter1,GetterYRef *getter2,TransformerLogLog *transformer,
              ImU32 col)

{
  float fVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ImVec2 IVar5;
  int iVar6;
  ImPlotPlot *pIVar7;
  GetterYRef *pGVar8;
  TransformerLogLog *pTVar9;
  ImVec2 IVar10;
  ImVec2 IVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  ImPlotContext *pIVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar6 = getter1->Count;
  iVar16 = getter2->Count;
  if (iVar6 < getter2->Count) {
    iVar16 = iVar6;
  }
  this->Prims = iVar16 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar15 = GImPlot;
  (this->P12).y = 0.0;
  fVar1 = *(float *)((long)getter1->Ys +
                    (long)((getter1->Offset % iVar6 + iVar6) % iVar6) * (long)getter1->Stride);
  dVar12 = log10((getter1->XScale * 0.0 + getter1->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar7 = pIVar15->CurrentPlot;
  dVar2 = pIVar15->LogDenX;
  dVar3 = (pIVar7->XAxis).Range.Min;
  dVar4 = (pIVar7->XAxis).Range.Max;
  dVar13 = log10((double)fVar1 / pIVar7->YAxis[transformer->YAxis].Range.Min);
  iVar6 = transformer->YAxis;
  pIVar7 = pIVar15->CurrentPlot;
  auVar17._8_8_ = dVar13;
  auVar17._0_8_ = dVar12;
  auVar18._8_8_ = pIVar15->LogDenY[iVar6];
  auVar18._0_8_ = dVar2;
  auVar18 = divpd(auVar17,auVar18);
  dVar2 = pIVar7->YAxis[iVar6].Range.Min;
  IVar5 = pIVar15->PixelRange[iVar6].Min;
  IVar10.y = (float)(pIVar15->My[iVar6] *
                     (((double)(float)auVar18._8_8_ * (pIVar7->YAxis[iVar6].Range.Max - dVar2) +
                      dVar2) - dVar2) + (double)IVar5.y);
  IVar10.x = (float)(pIVar15->Mx *
                     (((double)(float)auVar18._0_8_ * (dVar4 - dVar3) + dVar3) -
                     (pIVar7->XAxis).Range.Min) + (double)IVar5.x);
  this->P11 = IVar10;
  pIVar15 = GImPlot;
  pGVar8 = this->Getter2;
  pTVar9 = this->Transformer;
  dVar2 = pGVar8->YRef;
  dVar13 = log10((pGVar8->XScale * 0.0 + pGVar8->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar7 = pIVar15->CurrentPlot;
  dVar3 = pIVar15->LogDenX;
  dVar4 = (pIVar7->XAxis).Range.Min;
  dVar12 = (pIVar7->XAxis).Range.Max;
  dVar2 = log10(dVar2 / pIVar7->YAxis[pTVar9->YAxis].Range.Min);
  iVar6 = pTVar9->YAxis;
  pIVar7 = pIVar15->CurrentPlot;
  auVar19._8_8_ = dVar2;
  auVar19._0_8_ = dVar13;
  auVar14._8_8_ = pIVar15->LogDenY[iVar6];
  auVar14._0_8_ = dVar3;
  auVar18 = divpd(auVar19,auVar14);
  dVar2 = pIVar7->YAxis[iVar6].Range.Min;
  IVar5 = pIVar15->PixelRange[iVar6].Min;
  IVar11.y = (float)(pIVar15->My[iVar6] *
                     (((double)(float)auVar18._8_8_ * (pIVar7->YAxis[iVar6].Range.Max - dVar2) +
                      dVar2) - dVar2) + (double)IVar5.y);
  IVar11.x = (float)(pIVar15->Mx *
                     (((double)(float)auVar18._0_8_ * (dVar12 - dVar4) + dVar4) -
                     (pIVar7->XAxis).Range.Min) + (double)IVar5.x);
  this->P12 = IVar11;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }